

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall cmListFile::ParseFile(cmListFile *this,char *filename,bool topLevel,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  undefined7 in_register_00000011;
  pointer pcVar6;
  string name;
  cmListFileParser parser;
  value_type local_128;
  allocator local_f5;
  undefined4 local_f4;
  pointer *local_f0;
  cmMakefile *local_e8;
  undefined1 local_e0 [8];
  undefined1 local_d8 [8];
  cmListFile local_d0;
  undefined1 auStack_b8 [8];
  undefined1 local_b0 [24];
  pointer pcStack_98;
  pointer local_90;
  pointer pcStack_88;
  FILE *local_78;
  char **local_70;
  char *local_68;
  char *local_60 [2];
  string local_50;
  
  local_e8 = mf;
  bVar2 = cmsys::SystemTools::FileExists(filename);
  bVar3 = true;
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_50,filename,&local_f5);
    bVar3 = cmsys::SystemTools::FileIsDirectory(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3 != false) {
    return false;
  }
  local_f4 = (undefined4)CONCAT71(in_register_00000011,topLevel);
  local_d8 = (undefined1  [8])local_e8;
  local_e0 = (undefined1  [8])this;
  local_d0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)filename;
  local_d0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)cmListFileLexer_New();
  auStack_b8 = (undefined1  [8])0x0;
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
  local_b0._16_8_ = (FILE *)0x0;
  pcStack_98 = (pointer)0x0;
  local_90 = (pointer)0x0;
  pcStack_88 = (pointer)0x0;
  local_d0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b0;
  bVar3 = cmListFileParser::ParseFile((cmListFileParser *)local_e0);
  cmListFileParser::~cmListFileParser((cmListFileParser *)local_e0);
  if ((char)local_f4 == '\0') {
    return bVar3;
  }
  pcVar6 = (this->Functions).
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar6 != (this->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      cmsys::SystemTools::LowerCase((string *)local_e0,(string *)pcVar6);
      iVar4 = std::__cxx11::string::compare((char *)local_e0);
      if (local_e0 != (undefined1  [8])&local_d0) {
        operator_delete((void *)local_e0,
                        (ulong)((long)local_d0.Functions.
                                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if (iVar4 == 0) {
        local_f0 = &(this->Functions).
                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        goto LAB_003be8c9;
      }
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != (this->Functions).
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  local_f0 = &(this->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if ((ulong)((long)(this->Functions).
                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start) < 0x780) {
    local_d0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8;
    local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
    local_d0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_b8 = (undefined1  [8])0x0;
    paVar1 = &local_128.Value.field_2;
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    local_d0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_d0.Functions.
         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"project","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"set","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"if","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"endif","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"else","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"elseif","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"add_executable","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"add_library","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"target_link_libraries","")
    ;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"option","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"message","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_e0,&local_128.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = (this->Functions).
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar6 == (this->Functions).
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e0);
      goto LAB_003be8c9;
    }
    bVar2 = false;
    local_78 = (FILE *)this;
    do {
      cmsys::SystemTools::LowerCase(&local_128.Value,(string *)pcVar6);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e0,&local_128.Value);
      if (iVar5._M_node == (_Base_ptr)local_d8) {
        bVar2 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.Value._M_dataplus._M_p != &local_128.Value.field_2) {
        operator_delete(local_128.Value._M_dataplus._M_p,
                        local_128.Value.field_2._M_allocated_capacity + 1);
      }
    } while ((iVar5._M_node != (_Base_ptr)local_d8) && (pcVar6 = pcVar6 + 1, pcVar6 != *local_f0));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e0);
    this = (cmListFile *)local_78;
    if (!bVar2) goto LAB_003be8c9;
  }
  local_e8->CheckCMP0000 = true;
  cmMakefile::SetPolicyVersion(local_e8,"2.4");
LAB_003be8c9:
  if ((char)local_f4 != '\0') {
    pcVar6 = *(pointer *)this;
    if (pcVar6 != (pointer)((FILE *)this)->_IO_read_ptr) {
      do {
        cmsys::SystemTools::LowerCase((string *)local_e0,(string *)pcVar6);
        iVar4 = std::__cxx11::string::compare((char *)local_e0);
        if (local_e0 != (undefined1  [8])&local_d0) {
          operator_delete((void *)local_e0,
                          (ulong)((long)local_d0.Functions.
                                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if (iVar4 == 0) {
          return bVar3;
        }
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 != *local_f0);
    }
    local_d8 = (undefined1  [8])0x0;
    local_d0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_d0.Functions.
                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    local_d0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_b8 = (undefined1  [8])0x0;
    local_b0._0_8_ = 0;
    local_b0._8_8_ = (char *)0x0;
    local_e0 = (undefined1  [8])&local_d0;
    std::__cxx11::string::_M_replace((ulong)local_e0,0,(char *)0x0,0x4e30b7);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Project","");
    paVar1 = &local_128.Value.field_2;
    local_128.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,local_70,local_68 + (long)local_70);
    local_128.Delim = Unquoted;
    local_128.Line = 0;
    if (local_70 != local_60) {
      operator_delete(local_70,(ulong)(local_60[0] + 1));
    }
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)auStack_b8,
               &local_128);
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
              (&this->Functions,*(cmListFileFunction **)this,(value_type *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.Value._M_dataplus._M_p,
                      local_128.Value.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)auStack_b8);
    if (local_e0 != (undefined1  [8])&local_d0) {
      operator_delete((void *)local_e0,
                      (ulong)((long)local_d0.Functions.
                                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  return bVar3;
}

Assistant:

bool cmListFile::ParseFile(const char* filename,
                           bool topLevel,
                           cmMakefile *mf)
{
  if(!cmSystemTools::FileExists(filename) ||
     cmSystemTools::FileIsDirectory(filename))
    {
    return false;
    }

  bool parseError = false;

  {
  cmListFileParser parser(this, mf, filename);
  parseError = !parser.ParseFile();
  }

  // do we need a cmake_policy(VERSION call?
  if(topLevel)
  {
    bool hasVersion = false;
    // search for the right policy command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
    {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required")
      {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if(!hasVersion)
    {
      bool isProblem = true;
      if (this->Functions.size() < 30)
      {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for(std::vector<cmListFileFunction>::iterator i
              = this->Functions.begin();
            i != this->Functions.end(); ++i)
        {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end())
          {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem)
      {
      // Tell the top level cmMakefile to diagnose
      // this violation of CMP0000.
      mf->SetCheckCMP0000(true);

      // Implicitly set the version for the user.
      mf->SetPolicyVersion("2.4");
      }
    }
  }

  if(topLevel)
    {
    bool hasProject = false;
    // search for a project command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
      {
      if(cmSystemTools::LowerCase(i->Name) == "project")
        {
        hasProject = true;
        break;
        }
      }
    // if no project command is found, add one
    if(!hasProject)
      {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      this->Functions.insert(this->Functions.begin(),project);
      }
    }
  if(parseError)
    {
    return false;
    }
  return true;
}